

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
CorruptInternalNodes_ChildClaimsToBeOnHeap_Test::~CorruptInternalNodes_ChildClaimsToBeOnHeap_Test
          (CorruptInternalNodes_ChildClaimsToBeOnHeap_Test *this)

{
  (this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__CorruptInternalNodes_00273868;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_CorruptInternalNodes).index_);
  (this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__IndexFixture_00273670;
  pstore::database::~database
            (&(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.db_);
  in_memory_store::~in_memory_store
            (&(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.store_
            );
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (CorruptInternalNodes, ChildClaimsToBeOnHeap) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the first child field such it claims to be on the heap.
        {
            std::shared_ptr<internal_node> inode = this->load_inode (root);
            index_pointer & first = (*inode)[0];
            first =
                index_pointer{reinterpret_cast<internal_node *> (first.to_address ().absolute ())};
        }
        t1.commit ();
    }
    this->iterate ();
    this->find ();
}